

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIf.c
# Opt level: O0

Hop_Obj_t *
Abc_NodeIfToHop2_rec(Hop_Man_t *pHopMan,If_Man_t *pIfMan,If_Obj_t *pIfObj,Vec_Ptr_t *vVisited)

{
  int iVar1;
  If_Cut_t *pCut_00;
  void *pvVar2;
  Hop_Obj_t *pHVar3;
  Hop_Obj_t *pHVar4;
  Hop_Obj_t *gFunc1;
  Hop_Obj_t *gFunc0;
  Hop_Obj_t *gFunc;
  If_Obj_t *pTemp;
  If_Cut_t *pCut;
  Vec_Ptr_t *vVisited_local;
  If_Obj_t *pIfObj_local;
  If_Man_t *pIfMan_local;
  Hop_Man_t *pHopMan_local;
  
  pCut_00 = If_ObjCutBest(pIfObj);
  pvVar2 = If_CutData(pCut_00);
  if (pvVar2 == (void *)0x0) {
    Vec_PtrPush(vVisited,pCut_00);
    If_CutSetData(pCut_00,(void *)0x1);
    iVar1 = If_ObjIsCi(pIfObj);
    gFunc = (Hop_Obj_t *)pIfObj;
    if (iVar1 == 0) {
      for (; gFunc != (Hop_Obj_t *)0x0; gFunc = (Hop_Obj_t *)gFunc[1].field_0.pData) {
        pHVar3 = Abc_NodeIfToHop2_rec(pHopMan,pIfMan,(If_Obj_t *)gFunc->pFanin1,vVisited);
        if ((pHVar3 != (Hop_Obj_t *)0x1) &&
           (pHVar4 = Abc_NodeIfToHop2_rec(pHopMan,pIfMan,*(If_Obj_t **)&gFunc->field_0x20,vVisited),
           pHVar4 != (Hop_Obj_t *)0x1)) {
          pHVar3 = Hop_NotCond(pHVar3,(uint)(gFunc->field_0).iData >> 4 & 1);
          pHVar4 = Hop_NotCond(pHVar4,(uint)(gFunc->field_0).iData >> 5 & 1);
          gFunc0 = Hop_And(pHopMan,pHVar3,pHVar4);
          if (((uint)(gFunc->field_0).iData >> 6 & 1) != (*(uint *)pIfObj >> 6 & 1)) {
            gFunc0 = Hop_Not(gFunc0);
          }
          If_CutSetData(pCut_00,gFunc0);
          break;
        }
      }
      pHopMan_local = (Hop_Man_t *)If_CutData(pCut_00);
    }
    else {
      pHopMan_local = (Hop_Man_t *)If_CutData(pCut_00);
    }
  }
  else {
    pHopMan_local = (Hop_Man_t *)If_CutData(pCut_00);
  }
  return (Hop_Obj_t *)pHopMan_local;
}

Assistant:

Hop_Obj_t * Abc_NodeIfToHop2_rec( Hop_Man_t * pHopMan, If_Man_t * pIfMan, If_Obj_t * pIfObj, Vec_Ptr_t * vVisited )
{
    If_Cut_t * pCut;
    If_Obj_t * pTemp;
    Hop_Obj_t * gFunc, * gFunc0, * gFunc1;
    // get the best cut
    pCut = If_ObjCutBest(pIfObj);
    // if the cut is visited, return the result
    if ( If_CutData(pCut) )
        return (Hop_Obj_t *)If_CutData(pCut);
    // mark the node as visited
    Vec_PtrPush( vVisited, pCut );
    // insert the worst case
    If_CutSetData( pCut, (void *)1 );
    // skip in case of primary input
    if ( If_ObjIsCi(pIfObj) )
        return (Hop_Obj_t *)If_CutData(pCut);
    // compute the functions of the children
    for ( pTemp = pIfObj; pTemp; pTemp = pTemp->pEquiv )
    {
        gFunc0 = Abc_NodeIfToHop2_rec( pHopMan, pIfMan, pTemp->pFanin0, vVisited );
        if ( gFunc0 == (void *)1 )
            continue;
        gFunc1 = Abc_NodeIfToHop2_rec( pHopMan, pIfMan, pTemp->pFanin1, vVisited );
        if ( gFunc1 == (void *)1 )
            continue;
        // both branches are solved
        gFunc = Hop_And( pHopMan, Hop_NotCond(gFunc0, pTemp->fCompl0), Hop_NotCond(gFunc1, pTemp->fCompl1) ); 
        if ( pTemp->fPhase != pIfObj->fPhase )
            gFunc = Hop_Not(gFunc);
        If_CutSetData( pCut, gFunc );
        break;
    }
    return (Hop_Obj_t *)If_CutData(pCut);
}